

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicstransform.cpp
# Opt level: O0

void QGraphicsRotation::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  bool bVar2;
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  qreal qVar3;
  QVector3D QVar4;
  void *_v_1;
  void *_v;
  QGraphicsRotation *_t;
  uint in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  QGraphicsRotation *this;
  undefined8 local_40;
  float local_38;
  undefined8 local_30;
  float local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff5c = in_EDX;
    if (in_EDX == 0) {
      originChanged((QGraphicsRotation *)0xa2ee6d);
    }
    else if (in_EDX == 1) {
      angleChanged((QGraphicsRotation *)0xa2ee79);
    }
    else if (in_EDX == 2) {
      axisChanged((QGraphicsRotation *)0xa2ee85);
    }
  }
  if ((in_ESI != 5) ||
     (((bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsRotation::*)()>
                          (in_RCX,(void **)originChanged,0,0), !bVar2 &&
       (bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsRotation::*)()>
                          (in_RCX,(void **)angleChanged,0,1), !bVar2)) &&
      (bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsRotation::*)()>
                         (in_RCX,(void **)axisChanged,0,2), !bVar2)))) {
    if (in_ESI == 1) {
      this = *(QGraphicsRotation **)in_RCX;
      in_stack_ffffffffffffff58 = in_EDX;
      if (in_EDX == 0) {
        QVar4 = origin(this);
        local_30 = QVar4.v._0_8_;
        local_28 = QVar4.v[2];
        *(undefined8 *)&this->super_QGraphicsTransform = local_30;
        *(float *)&(this->super_QGraphicsTransform).field_0x8 = local_28;
      }
      else if (in_EDX == 1) {
        qVar3 = angle((QGraphicsRotation *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        *(qreal *)&this->super_QGraphicsTransform = qVar3;
      }
      else if (in_EDX == 2) {
        QVar4 = axis(this);
        local_40 = QVar4.v._0_8_;
        local_38 = QVar4.v[2];
        *(undefined8 *)&this->super_QGraphicsTransform = local_40;
        *(float *)&(this->super_QGraphicsTransform).field_0x8 = local_38;
      }
    }
    if (in_ESI == 2) {
      if (in_EDX == 0) {
        setOrigin((QGraphicsRotation *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                  ,(QVector3D *)(ulong)in_stack_ffffffffffffff50);
      }
      else if (in_EDX == 1) {
        setAngle(*(QGraphicsRotation **)in_RCX,
                 (qreal)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      else if (in_EDX == 2) {
        setAxis((QGraphicsRotation *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                (QVector3D *)CONCAT44(2,in_stack_ffffffffffffff50));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsRotation::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsRotation *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->originChanged(); break;
        case 1: _t->angleChanged(); break;
        case 2: _t->axisChanged(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsRotation::*)()>(_a, &QGraphicsRotation::originChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsRotation::*)()>(_a, &QGraphicsRotation::angleChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsRotation::*)()>(_a, &QGraphicsRotation::axisChanged, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QVector3D*>(_v) = _t->origin(); break;
        case 1: *reinterpret_cast<qreal*>(_v) = _t->angle(); break;
        case 2: *reinterpret_cast<QVector3D*>(_v) = _t->axis(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOrigin(*reinterpret_cast<QVector3D*>(_v)); break;
        case 1: _t->setAngle(*reinterpret_cast<qreal*>(_v)); break;
        case 2: _t->setAxis(*reinterpret_cast<QVector3D*>(_v)); break;
        default: break;
        }
    }
}